

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O2

string * kratos::fields_to_json
                   (string *__return_storage_ptr__,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                   *vars)

{
  undefined8 uVar1;
  undefined8 extraout_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  _Rb_tree_node_base *p_Var2;
  basic_string_view<char> bVar3;
  undefined1 auVar4 [16];
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  string local_b8;
  string local_98;
  undefined1 auStack_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entries;
  undefined1 auStack_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> content;
  
  content.field_2._8_8_ = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"{",(allocator<char> *)auStack_58);
  auStack_78 = (undefined1  [8])0x0;
  entries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  entries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_78,(vars->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
  auVar4._8_8_ = extraout_RDX;
  auVar4._0_8_ = (vars->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var2 = auVar4._0_8_,
        (_Rb_tree_header *)p_Var2 != &(vars->_M_t)._M_impl.super__Rb_tree_header) {
    full_path_abi_cxx11_(&local_98,*(kratos **)(p_Var2 + 2),auVar4._8_8_);
    auStack_58 = *(undefined1 (*) [8])(p_Var2 + 1);
    content._M_dataplus._M_p = (pointer)p_Var2[1]._M_parent;
    content._M_string_length = (size_type)local_98._M_dataplus._M_p;
    content.field_2._M_allocated_capacity = local_98._M_string_length;
    bVar3 = fmt::v7::to_string_view<char,_0>("\"{0}\": \"{1}\"");
    format_str.data_ = (char *)bVar3.size_;
    format_str.size_ = 0xdd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_58;
    fmt::v7::detail::vformat_abi_cxx11_(&local_b8,(detail *)bVar3.data_,format_str,args);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_78,
               &local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    auVar4 = std::_Rb_tree_increment(p_Var2);
  }
  local_b8._M_dataplus._M_p = (pointer)auStack_78;
  local_b8._M_string_length =
       (size_type)
       entries.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b8.field_2._M_allocated_capacity = (long)": must be in range [0, " + 0x15;
  local_b8.field_2._8_8_ = 2;
  local_98._M_string_length =
       (size_type)
       fmt::v7::detail::
       value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
       format_custom_arg<fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,fmt::v7::formatter<fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,char,void>>
  ;
  local_98._M_dataplus._M_p = (pointer)&local_b8;
  bVar3 = fmt::v7::to_string_view<char,_0>("{0}");
  format_str_00.data_ = (char *)bVar3.size_;
  format_str_00.size_ = 0xf;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_98;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)auStack_58,(detail *)bVar3.data_,format_str_00,args_00);
  uVar1 = content.field_2._8_8_;
  std::__cxx11::string::append((string *)content.field_2._8_8_);
  std::__cxx11::string::append((char *)uVar1);
  std::__cxx11::string::~string((string *)auStack_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_78);
  return (string *)uVar1;
}

Assistant:

std::string fields_to_json(const std::map<std::string, std::shared_ptr<Var>> &vars) {
    // layman's json serializer
    std::string result = "{";
    std::vector<std::string> entries;
    entries.reserve(vars.size());
    for (auto const &[name, var] : vars) {
        entries.emplace_back(fmt::format(R"("{0}": "{1}")", name, full_path(var.get())));
    }
    auto content = fmt::format("{0}", fmt::join(entries.begin(), entries.end(), ", "));
    result.append(content);
    result.append("}");
    return result;
}